

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O3

void __thiscall CTcParser::CTcParser(CTcParser *this)

{
  CTcPrsSymtab *this_00;
  CTcObjTemplateInst *pCVar1;
  tctarg_prop_id_t *ptVar2;
  CTPNStmObject **ppCVar3;
  CTcEmbedTokenList *pCVar4;
  CTcTokenEle *pCVar5;
  ulong uVar6;
  
  this->module_name_ = (char *)0x0;
  this->module_seqno_ = 0;
  this->field_0xec = this->field_0xec & 0xfc;
  this_00 = (CTcPrsSymtab *)CTcPrsMem::alloc(G_prsmem,0x30);
  CTcPrsSymtab::CTcPrsSymtab(this_00,(CTcPrsSymtab *)0x0);
  this->global_symtab_ = this_00;
  this->enclosing_stm_ = (CTPNStmEnclosing *)0x0;
  this->cur_desc_ = (CTcTokFileDesc *)0x0;
  this->cur_linenum_ = 0;
  this->dict_cur_ = (CTcDictEntry *)0x0;
  this->dict_head_ = (CTcDictEntry *)0x0;
  this->dict_tail_ = (CTcDictEntry *)0x0;
  this->gramprod_head_ = (CTcGramProdEntry *)0x0;
  this->gramprod_tail_ = (CTcGramProdEntry *)0x0;
  this->obj_sym_list_ = (CTcSymbol **)0x0;
  this->obj_dict_list_ = (CTcDictEntry **)0x0;
  this->obj_file_dict_idx_ = 0;
  this->obj_file_sym_idx_ = 0;
  this->dict_prop_head_ = (CTcDictPropEntry *)0x0;
  this->template_head_ = (CTcObjTemplate *)0x0;
  this->template_tail_ = (CTcObjTemplate *)0x0;
  this->template_expr_max_ = 0x10;
  pCVar1 = (CTcObjTemplateInst *)CTcPrsMem::alloc(G_prsmem,0x500);
  this->template_expr_ = pCVar1;
  this->goto_symtab_ = (CTcPrsSymtab *)0x0;
  this->local_symtab_ = (CTcPrsSymtab *)0x0;
  this->enclosing_local_symtab_ = (CTcPrsSymtab *)0x0;
  this->debug_symtab_ = (CTcPrsDbgSymtab *)0x0;
  uVar6 = 0;
  this->local_cnt_ = 0;
  this->max_local_cnt_ = 0;
  this->str_template_head_ = (CTcStrTemplate *)0x0;
  this->str_template_tail_ = (CTcStrTemplate *)0x0;
  this->field_0xec = this->field_0xec & 0xfa;
  this->nested_stm_head_ = (CTPNStmTop *)0x0;
  this->nested_stm_tail_ = (CTPNStmTop *)0x0;
  this->anon_obj_head_ = (CTcSymObj *)0x0;
  this->anon_obj_tail_ = (CTcSymObj *)0x0;
  this->nonsym_obj_head_ = (tcprs_nonsym_obj *)0x0;
  this->nonsym_obj_tail_ = (tcprs_nonsym_obj *)0x0;
  this->ctx_var_props_size_ = 0x32;
  ptVar2 = (tctarg_prop_id_t *)malloc(100);
  this->ctx_var_props_ = ptVar2;
  this->ctx_var_props_cnt_ = 0;
  this->ctx_var_props_used_ = 0;
  this->next_ctx_arr_idx_ = 2;
  this->self_valid_ = 0;
  this->next_enum_id_ = 1;
  this->plus_prop_ = (CTcSymProp *)0x0;
  this->exp_head_ = (CTcPrsExport *)0x0;
  this->exp_tail_ = (CTcPrsExport *)0x0;
  this->plus_stack_alloc_ = 0x20;
  ppCVar3 = (CTPNStmObject **)malloc(0x100);
  this->plus_stack_ = ppCVar3;
  do {
    this->plus_stack_[uVar6] = (CTPNStmObject *)0x0;
    uVar6 = uVar6 + 1;
  } while (uVar6 < this->plus_stack_alloc_);
  this->cur_code_body_ = (CTcCodeBodyRef *)0x0;
  this->self_referenced_ = 0;
  this->full_method_ctx_referenced_ = 0;
  this->local_ctx_needs_self_ = 0;
  this->local_ctx_needs_full_method_ctx_ = 0;
  pCVar4 = (CTcEmbedTokenList *)operator_new(0x18);
  pCVar5 = (CTcTokenEle *)operator_new(0x38);
  pCVar5->nxt_ = (CTcTokenEle *)0x0;
  pCVar5->prv_ = (CTcTokenEle *)0x0;
  pCVar4->head = pCVar5;
  pCVar4->wrt = pCVar5;
  pCVar4->cnt = 0;
  this->embed_toks_ = pCVar4;
  return;
}

Assistant:

CTcParser::CTcParser()
{
    size_t i;
    
    /* we don't have any module information yet */
    module_name_ = 0;
    module_seqno_ = 0;

    /* start out in normal mode */
    pp_expr_mode_ = FALSE;
    src_group_mode_ = FALSE;

    /* create the global symbol table */
    global_symtab_ = new CTcPrsSymtab(0);

    /* no enclosing statement yet */
    enclosing_stm_ = 0;

    /* no source location yet */
    cur_desc_ = 0;
    cur_linenum_ = 0;

    /* no dictionaries yet */
    dict_cur_ = 0;
    dict_head_ = dict_tail_ = 0;

    /* no object file dictionary list yet */
    obj_dict_list_ = 0;
    obj_file_dict_idx_ = 0;

    /* no dictionary properties yet */
    dict_prop_head_ = 0;

    /* no grammar productions yet */
    gramprod_head_ = gramprod_tail_ = 0;

    /* no object file symbol list yet */
    obj_sym_list_ = 0;
    obj_file_sym_idx_ = 0;

    /* no object templates yet */
    template_head_ = template_tail_ = 0;

    /* allocate some initial template parsing space */
    template_expr_max_ = 16;
    template_expr_ = (CTcObjTemplateInst *)G_prsmem->
                     alloc(sizeof(template_expr_[0]) * template_expr_max_);

    /* no string templates yet */
    str_template_head_ = str_template_tail_ = 0;

    /* no locals yet */
    local_cnt_ = max_local_cnt_ = 0;

    /* no local or goto symbol table yet */
    local_symtab_ = 0;
    enclosing_local_symtab_ = 0;
    goto_symtab_ = 0;

    /* no debugger local symbol table yet */
    debug_symtab_ = 0;

    /* not in a preprocessor constant expression */
    pp_expr_mode_ = FALSE;

    /* assume we're doing full compilation */
    syntax_only_ = FALSE;

    /* no nested top-level statements yet */
    nested_stm_head_ = 0;
    nested_stm_tail_ = 0;

    /* no anonymous objects yet */
    anon_obj_head_ = 0;
    anon_obj_tail_ = 0;

    /* no non-symbol objects yet */
    nonsym_obj_head_ = 0;
    nonsym_obj_tail_ = 0;

    /* allocate an initial context variable property array */
    ctx_var_props_size_ = 50;
    ctx_var_props_ = (tctarg_prop_id_t *)
                     t3malloc(ctx_var_props_size_ * sizeof(tctarg_prop_id_t));

    /* no context variable properties assigned yet */
    ctx_var_props_cnt_ = 0;
    ctx_var_props_used_ = 0;

    /* 
     *   no context variable indices assigned yet - start at one higher
     *   than the index at which we always store 'self' 
     */
    next_ctx_arr_idx_ = TCPRS_LOCAL_CTX_METHODCTX + 1;

    /* 'self' isn't valid yet */
    self_valid_ = FALSE;

    /* start at enum ID 1 (let 0 serve as an invalid value) */
    next_enum_id_ = 1;

    /* the '+' property is not yet defined */
    plus_prop_ = 0;

    /* no exported symbols yet */
    exp_head_ = exp_tail_ = 0;

    /* allocate an initial '+' stack */
    plus_stack_alloc_ = 32;
    plus_stack_ = (CTPNStmObject **)
                  t3malloc(plus_stack_alloc_ * sizeof(*plus_stack_));

    /* clear out the stack */
    for (i = 0 ; i < plus_stack_alloc_ ; ++i)
        plus_stack_[i] = 0;

    /* there's no current code body (function/method body) yet */
    cur_code_body_ = 0;

    /* nothing in the local context has been referenced yet */
    self_referenced_ = FALSE;
    local_ctx_needs_self_ = FALSE;
    full_method_ctx_referenced_ = FALSE;
    local_ctx_needs_full_method_ctx_ = FALSE;

    /* create the embedded expression list object */
    embed_toks_ = new CTcEmbedTokenList();
}